

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

void __thiscall BackwardPass::TraceDeadStoreOfInstrsForScopeObjectRemoval(BackwardPass *this)

{
  undefined2 uVar1;
  Instr *pIVar2;
  bool bVar3;
  uint uVar4;
  JITTimeFunctionBody *pJVar5;
  char16 *pcVar6;
  
  pIVar2 = this->currentInstr;
  bVar3 = Func::IsStackArgsEnabled(pIVar2->m_func);
  if (((bVar3) && (uVar1 = pIVar2->m_opcode, 0xfffd < (ushort)(uVar1 - 0x21b))) &&
     (this->currentPrePassLoop == (Loop *)0x0)) {
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,StackArgFormalsOptPhase);
    if (bVar3) {
      pJVar5 = JITTimeWorkItem::GetJITFunctionBody(pIVar2->m_func->m_workItem);
      pcVar6 = JITTimeFunctionBody::GetDisplayName(pJVar5);
      pJVar5 = JITTimeWorkItem::GetJITFunctionBody(pIVar2->m_func->m_workItem);
      uVar4 = JITTimeFunctionBody::GetFunctionNumber(pJVar5);
      Output::Print(L"StackArgFormals : %s (%d) :Removing Scope object creation in Deadstore pass. \n"
                    ,pcVar6,(ulong)uVar4);
      Output::Flush();
      return;
    }
  }
  return;
}

Assistant:

void
BackwardPass::TraceDeadStoreOfInstrsForScopeObjectRemoval()
{
    IR::Instr * instr = this->currentInstr;

    if (instr->m_func->IsStackArgsEnabled())
    {
        if ((instr->m_opcode == Js::OpCode::InitCachedScope || instr->m_opcode == Js::OpCode::NewScopeObject) && !IsPrePass())
        {
            if (PHASE_TRACE1(Js::StackArgFormalsOptPhase))
            {
                Output::Print(_u("StackArgFormals : %s (%d) :Removing Scope object creation in Deadstore pass. \n"), instr->m_func->GetJITFunctionBody()->GetDisplayName(), instr->m_func->GetFunctionNumber());
                Output::Flush();
            }
        }
    }
}